

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Vec4f __thiscall embree::XMLLoader::load<embree::Vec4<float>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  runtime_error *this_01;
  long *in_RDX;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  Vec4f VVar4;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = *(Token **)(*in_RDX + 0x98);
  if (*(long *)(*in_RDX + 0xa0) - (long)this_00 == 0x120) {
    fVar1 = Token::Float(this_00,true);
    fVar2 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x48),true);
    fVar3 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x90),true);
    VVar4.field_0._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0xd8),true);
    VVar4.field_0.field_0.y = (float)extraout_XMM0_Db;
    *(float *)&(this->path).filename._M_dataplus._M_p = fVar1;
    *(float *)((long)&(this->path).filename._M_dataplus._M_p + 4) = fVar2;
    *(float *)&(this->path).filename._M_string_length = fVar3;
    *(float *)((long)&(this->path).filename._M_string_length + 4) = VVar4.field_0._0_4_;
    VVar4.field_0.field_0.z = fVar3;
    VVar4.field_0.field_0.w = 0.0;
    return (Vec4f)VVar4.field_0;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_58,(ParseLocation *)(*in_RDX + 0x10));
  std::operator+(&local_38,&local_58,": wrong float4 body");
  std::runtime_error::runtime_error(this_01,(string *)&local_38);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec4f XMLLoader::load<Vec4f>(const Ref<XML>& xml) {
    if (xml->body.size() != 4) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float4 body");
    return Vec4f(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float(),xml->body[3].Float());
  }